

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxNode.cpp
# Opt level: O3

SyntaxToken * __thiscall
psy::C::SyntaxNode::findValidToken
          (SyntaxToken *__return_storage_ptr__,SyntaxNode *this,
          vector<psy::C::SyntaxHolder,_std::allocator<psy::C::SyntaxHolder>_> *syntaxHolders)

{
  Variant VVar1;
  pointer pSVar2;
  bool bVar3;
  IndexType IVar4;
  IndexType IVar5;
  SyntaxNode *pSVar6;
  SyntaxNodeList *pSVar7;
  pointer this_00;
  SyntaxToken local_68;
  
  this_00 = (syntaxHolders->
            super__Vector_base<psy::C::SyntaxHolder,_std::allocator<psy::C::SyntaxHolder>_>)._M_impl
            .super__Vector_impl_data._M_start;
  pSVar2 = (syntaxHolders->
           super__Vector_base<psy::C::SyntaxHolder,_std::allocator<psy::C::SyntaxHolder>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (this_00 != pSVar2) {
    do {
      VVar1 = this_00->variant_;
      if (VVar1 == NodeList) {
        pSVar7 = SyntaxHolder::nodeList(this_00);
        if (pSVar7 != (SyntaxNodeList *)0x0) {
          pSVar7 = SyntaxHolder::nodeList(this_00);
          (**pSVar7->_vptr_SyntaxNodeList)(__return_storage_ptr__,pSVar7);
          SyntaxToken::invalid();
          bVar3 = operator!=(__return_storage_ptr__,&local_68);
LAB_0029d2f8:
          SyntaxToken::~SyntaxToken(&local_68);
          if (bVar3 != false) {
            return __return_storage_ptr__;
          }
          SyntaxToken::~SyntaxToken(__return_storage_ptr__);
        }
      }
      else if (VVar1 == Node) {
        pSVar6 = SyntaxHolder::node(this_00);
        if (pSVar6 != (SyntaxNode *)0x0) {
          pSVar6 = SyntaxHolder::node(this_00);
          firstToken(__return_storage_ptr__,pSVar6);
          SyntaxToken::invalid();
          bVar3 = operator!=(__return_storage_ptr__,&local_68);
          goto LAB_0029d2f8;
        }
      }
      else if (VVar1 == Token) {
        IVar4 = SyntaxHolder::tokenIndex(this_00);
        IVar5 = LexedTokens::invalidIndex();
        if (IVar4 != IVar5) {
          IVar4 = SyntaxHolder::tokenIndex(this_00);
          tokenAtIndex(__return_storage_ptr__,this,IVar4);
          return __return_storage_ptr__;
        }
      }
      this_00 = this_00 + 1;
    } while (this_00 != pSVar2);
  }
  SyntaxToken::SyntaxToken(__return_storage_ptr__,(SyntaxTree *)0x0);
  return __return_storage_ptr__;
}

Assistant:

SyntaxToken SyntaxNode::findValidToken(const std::vector<SyntaxHolder>& syntaxHolders) const
{
    for (const auto& holder : syntaxHolders) {
        switch (holder.variant()) {
            case SyntaxHolder::Variant::Token:
                if (holder.tokenIndex() != LexedTokens::invalidIndex())
                    return tokenAtIndex(holder.tokenIndex());
                break;

            case SyntaxHolder::Variant::Node:
                if (holder.node()) {
                    auto tk = holder.node()->firstToken();
                    if (tk != SyntaxToken::invalid())
                        return tk;
                }
                break;

            case SyntaxHolder::Variant::NodeList:
                if (holder.nodeList()) {
                    auto tk = holder.nodeList()->firstToken();
                    if (tk != SyntaxToken::invalid())
                        return tk;
                }
                break;
        }
    }
    return 0;
}